

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::pp_charset(CTcTokenizer *this)

{
  int iVar1;
  long in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar2;
  
  uVar2 = false;
  if (*(long *)(in_RDI + 0x58) != 0) {
    iVar1 = CTcTokStream::get_charset_error(*(CTcTokStream **)(in_RDI + 0x58));
    uVar2 = iVar1 != 0;
  }
  iVar1 = 0x2714;
  if ((bool)uVar2 != false) {
    iVar1 = 0x2713;
  }
  log_error(iVar1);
  clear_linebuf((CTcTokenizer *)CONCAT17(uVar2,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void CTcTokenizer::pp_charset()
{
    /* 
     *   Encountering a #charset directive within the tokenizer is always
     *   an error.  If the file opener managed to use a #charset, we'll
     *   never see it, because the file opener will have skipped it before
     *   giving us the file.
     *   
     *   If we flagged a #charset error when opening the file, indicate
     *   that the problem is that the character set given was unloadable;
     *   otherwise, the problem is that #charset is in the wrong place.  
     */
    log_error(str_ != 0 && str_->get_charset_error()
              ? TCERR_CANT_LOAD_CHARSET : TCERR_UNEXPECTED_CHARSET);

    /* don't retain this pragma in the result */
    clear_linebuf();
}